

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

OpenGLExtensions __thiscall QOpenGLExtensions::openGLExtensions(QOpenGLExtensions *this)

{
  int iVar1;
  long lVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  QOpenGLFunctionsPrivateEx *d;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  long lVar3;
  QFlag QVar4;
  QFlag local_10;
  QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *in_RDI + -0x10;
  }
  if (lVar2 == 0) {
    memset(&local_c,0,4);
    QFlags<QOpenGLExtensions::OpenGLExtension>::QFlags
              ((QFlags<QOpenGLExtensions::OpenGLExtension> *)0x90d374);
  }
  else {
    lVar3 = lVar2;
    if (*(int *)(lVar2 + 0xb70) == -1) {
      iVar1 = qt_gl_resolve_extensions();
      *(int *)(lVar2 + 0xb70) = iVar1;
    }
    QVar4.i = (int)((ulong)lVar3 >> 0x20);
    QFlag::QFlag(&local_10,*(int *)(lVar2 + 0xb70));
    QFlags<QOpenGLExtensions::OpenGLExtension>::QFlagsStorageHelper
              ((QFlags<QOpenGLExtensions::OpenGLExtension> *)
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),QVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4>)
           (QFlagsStorageHelper<QOpenGLExtensions::OpenGLExtension,_4>)
           local_c.super_QFlagsStorage<QOpenGLExtensions::OpenGLExtension>.i;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLExtensions::OpenGLExtensions QOpenGLExtensions::openGLExtensions()
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return { };
    if (d->m_extensions == -1)
        d->m_extensions = qt_gl_resolve_extensions();
    return QOpenGLExtensions::OpenGLExtensions(d->m_extensions);
}